

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O3

void __thiscall
HSimplexNla::transformForUpdate
          (HSimplexNla *this,HVector *aq,HVector *ep,HighsInt variable_in,HighsInt row_out)

{
  double dVar1;
  int iVar2;
  int iVar3;
  HighsScale *pHVar4;
  pointer pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  string local_70;
  string local_50;
  
  if (this->scale_ != (HighsScale *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pack aq Bf ","");
    reportPackValue(this,&local_50,aq,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pHVar4 = this->scale_;
    if (pHVar4 == (HighsScale *)0x0) {
      dVar8 = 1.0;
    }
    else {
      iVar2 = this->lp_->num_col_;
      if (variable_in < iVar2) {
        dVar8 = (pHVar4->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[variable_in];
      }
      else {
        dVar8 = 1.0 / (pHVar4->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[variable_in - iVar2];
      }
    }
    iVar2 = aq->packCount;
    if (0 < (long)iVar2) {
      pdVar5 = (aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        pdVar5[lVar6] = pdVar5[lVar6] * dVar8;
        lVar6 = lVar6 + 1;
      } while (iVar2 != lVar6);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"pack aq Af ","");
    reportPackValue(this,&local_70,aq,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pdVar5 = (aq->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = pdVar5[row_out];
    pdVar5[row_out] = dVar8 * dVar1;
    pHVar4 = this->scale_;
    if (pHVar4 == (HighsScale *)0x0) {
      dVar7 = 1.0;
    }
    else {
      iVar2 = this->basic_index_[row_out];
      iVar3 = this->lp_->num_col_;
      if (iVar2 < iVar3) {
        dVar7 = (pHVar4->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar2];
      }
      else {
        dVar7 = 1.0 / (pHVar4->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2 - iVar3];
      }
    }
    pdVar5[row_out] = (dVar8 * dVar1) / dVar7;
    iVar2 = ep->packCount;
    if (0 < (long)iVar2) {
      pdVar5 = (ep->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        pdVar5[lVar6] = pdVar5[lVar6] / dVar7;
        lVar6 = lVar6 + 1;
      } while (iVar2 != lVar6);
    }
  }
  return;
}

Assistant:

void HSimplexNla::transformForUpdate(HVector* aq, HVector* ep,
                                     const HighsInt variable_in,
                                     const HighsInt row_out) {
  if (scale_ == NULL) return;
  // For (\hat)aq, UPDATE needs packValue and array[row_out] to
  // correspond to \bar{B}^{-1}(R.aq.cq), but CB.\bar{B}^{-1}(R.aq)
  // has been computed.
  //
  // Hence packValue and array[row_out] need to be scaled by cq;
  //
  // array[row_out] has to be unscaled by the corresponding entry of
  // CB
  //
  reportPackValue("pack aq Bf ", aq);
  double cq_scale_factor = variableScaleFactor(variable_in);

  for (HighsInt ix = 0; ix < aq->packCount; ix++)
    aq->packValue[ix] *= cq_scale_factor;
  reportPackValue("pack aq Af ", aq);
  //
  // Now focus on the pivot value, aq->array[row_out]
  double pivot_in_scaled_space = pivotInScaledSpace(aq, variable_in, row_out);
  // First scale by cq
  aq->array[row_out] *= cq_scale_factor;
  //
  // Also have to unscale by cp
  double cp_scale_factor = basicColScaleFactor(row_out);
  aq->array[row_out] /= cp_scale_factor;
  assert(pivot_in_scaled_space == aq->array[row_out]);
  // For (\hat)ep, UPDATE needs packValue to correspond to
  // \bar{B}^{-T}ep, but R.\bar{B}^{-T}(CB.ep) has been computed.
  //
  // Hence packValue needs to be unscaled by cp
  for (HighsInt ix = 0; ix < ep->packCount; ix++)
    ep->packValue[ix] /= cp_scale_factor;
}